

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O3

PAL_ERROR __thiscall
CorUnix::CPalSynchronizationManager::DispatchPendingAPCs
          (CPalSynchronizationManager *this,CPalThread *pthrCurrent)

{
  CRITICAL_SECTION *pCriticalSection;
  _ThreadApcInfoNode *p_Var1;
  int new_level;
  _ThreadApcInfoNode *pobj;
  uint uVar2;
  uint uVar3;
  PAL_ERROR PVar4;
  
  pCriticalSection = &pthrCurrent->m_csLock;
  InternalEnterCriticalSection(pthrCurrent,pCriticalSection);
  pobj = (pthrCurrent->apcInfo).m_ptainHead;
  if (pobj == (_ThreadApcInfoNode *)0x0) {
    PVar4 = 0x490;
  }
  else {
    uVar3 = 0;
    do {
      (pthrCurrent->apcInfo).m_ptainHead = (PThreadApcInfoNode)0x0;
      (pthrCurrent->apcInfo).m_ptainTail = (PThreadApcInfoNode)0x0;
      InternalLeaveCriticalSection(pthrCurrent,pCriticalSection);
      do {
        uVar2 = uVar3;
        p_Var1 = pobj->pNext;
        new_level = DBG_change_entrylevel(0);
        if (PAL_InitializeChakraCoreCalled == false) {
          abort();
        }
        (*pobj->pfnAPC)(pobj->pAPCData);
        DBG_change_entrylevel(new_level);
        uVar3 = uVar2 + 1;
        CSynchCache<CorUnix::_ThreadApcInfoNode>::Add
                  (&this->m_cacheThreadApcInfoNodes,pthrCurrent,pobj);
        pobj = p_Var1;
      } while (p_Var1 != (_ThreadApcInfoNode *)0x0);
      InternalEnterCriticalSection(pthrCurrent,pCriticalSection);
      pobj = (pthrCurrent->apcInfo).m_ptainHead;
    } while (pobj != (_ThreadApcInfoNode *)0x0);
    PVar4 = 0x490;
    if (uVar2 < 0x7fffffff) {
      PVar4 = 0;
    }
  }
  InternalLeaveCriticalSection(pthrCurrent,pCriticalSection);
  return PVar4;
}

Assistant:

PAL_ERROR CPalSynchronizationManager::DispatchPendingAPCs(
        CPalThread * pthrCurrent)
    {
        ThreadApcInfoNode * ptainNode, * ptainLocalHead;
        int iAPCsCalled = 0;

        while (TRUE)
        {
            // Lock
            pthrCurrent->Lock(pthrCurrent);
            ptainLocalHead = pthrCurrent->apcInfo.m_ptainHead;
            if (ptainLocalHead)
            {
                pthrCurrent->apcInfo.m_ptainHead = NULL;
                pthrCurrent->apcInfo.m_ptainTail = NULL;
            }
            // Unlock
            pthrCurrent->Unlock(pthrCurrent);

            if (NULL == ptainLocalHead)
            {
                break;
            }

            while (ptainLocalHead)
            {
                ptainNode = ptainLocalHead;
                ptainLocalHead = ptainNode->pNext;

#if _ENABLE_DEBUG_MESSAGES_
                // reset ENTRY nesting level back to zero while
                // inside the callback ...
                int iOldLevel = DBG_change_entrylevel(0);
#endif /* _ENABLE_DEBUG_MESSAGES_ */

                TRACE("Calling APC %p with parameter %#x\n",
                      ptainNode->pfnAPC, ptainNode->pfnAPC);

                // Actual APC call
                ptainNode->pfnAPC(ptainNode->pAPCData);

#if _ENABLE_DEBUG_MESSAGES_
                // ... and set nesting level back to what it was
                DBG_change_entrylevel(iOldLevel);
#endif /* _ENABLE_DEBUG_MESSAGES_ */

                iAPCsCalled++;
                m_cacheThreadApcInfoNodes.Add(pthrCurrent, ptainNode);
            }
        }

        return (iAPCsCalled > 0) ? NO_ERROR : ERROR_NOT_FOUND;
    }